

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O0

string * __thiscall
llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
          (string *__return_storage_ptr__,basic *this,SmallString<16U> *in)

{
  char cVar1;
  long lVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  size_t sVar5;
  ostream *poVar6;
  char *local_1b0;
  const_iterator i;
  ostringstream ss;
  SmallString<16U> *in_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  for (local_1b0 = *(char **)this; lVar2 = *(long *)this,
      sVar5 = llvm::SmallVectorBase::size((SmallVectorBase *)this),
      local_1b0 != (char *)(lVar2 + sVar5); local_1b0 = local_1b0 + 1) {
    cVar1 = *local_1b0;
    if (cVar1 == '\b') {
      std::operator<<((ostream *)&i,"\\b");
    }
    else if (cVar1 == '\t') {
      std::operator<<((ostream *)&i,"\\t");
    }
    else if (cVar1 == '\n') {
      std::operator<<((ostream *)&i,"\\n");
    }
    else if (cVar1 == '\f') {
      std::operator<<((ostream *)&i,"\\f");
    }
    else if (cVar1 == '\r') {
      std::operator<<((ostream *)&i,"\\r");
    }
    else if (cVar1 == '\"') {
      std::operator<<((ostream *)&i,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::operator<<((ostream *)&i,"\\\\");
    }
    else if ((*local_1b0 < '\0') || ('\x1f' < *local_1b0)) {
      std::operator<<((ostream *)&i,*local_1b0);
    }
    else {
      poVar6 = std::operator<<((ostream *)&i,"\\u");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
      _Var4 = std::setw(4);
      poVar6 = std::operator<<(poVar6,_Var4);
      _Var3 = std::setfill<char>('0');
      poVar6 = std::operator<<(poVar6,_Var3._M_c);
      std::ostream::operator<<(poVar6,(int)*local_1b0);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string escapeForJSON(String const& in) {
    std::ostringstream ss;
    for (auto i = in.begin(); i != in.end(); i++) {
      switch (*i) {
      case '\\': ss << "\\\\"; break;
      case '"': ss << "\\\""; break;
      case '\b': ss << "\\b"; break;
      case '\n': ss << "\\n"; break;
      case '\f': ss << "\\f"; break;
      case '\r': ss << "\\r"; break;
      case '\t': ss << "\\t"; break;
      default:
        if ('\x00' <= *i && *i <= '\x1f') {
          ss << "\\u" << std::hex << std::setw(4) << std::setfill('0')
             << (int)*i;
        } else {
          ss << *i;
        }
      }
    }
    return ss.str();
  }